

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O3

void __thiscall glslang::TIntermAggregate::traverse(TIntermAggregate *this,TIntermTraverser *it)

{
  pointer ppTVar1;
  pointer *pppTVar2;
  int iVar3;
  uint uVar4;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  __tmp;
  pointer ppTVar5;
  
  if ((it->preVisit == true) &&
     (iVar3 = (*it->_vptr_TIntermTraverser[7])(it,0,this), (char)iVar3 == '\0')) {
    return;
  }
  TIntermTraverser::incrementDepth(it,(TIntermNode *)this);
  if (it->rightToLeft == true) {
    ppTVar5 = (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar5 ==
        (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_00493712:
      it->depth = it->depth + -1;
      pppTVar2 = &(it->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + -1;
      goto LAB_0049371b;
    }
    uVar4 = 1;
    do {
      ppTVar1 = ppTVar5 + -1;
      ppTVar5 = ppTVar5 + -1;
      (*(*ppTVar1)->_vptr_TIntermNode[2])(*ppTVar1,it);
      if ((((uVar4 & 1) != 0) && (it->inVisit == true)) &&
         (*ppTVar5 !=
          *(this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
           super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
           super__Vector_impl_data._M_start)) {
        uVar4 = (*it->_vptr_TIntermTraverser[7])(it,1,this);
      }
    } while (ppTVar5 !=
             (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  else {
    ppTVar5 = (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppTVar5 ==
        (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00493712;
    uVar4 = 1;
    do {
      (*(*ppTVar5)->_vptr_TIntermNode[2])(*ppTVar5,it);
      if ((((uVar4 & 1) != 0) && (it->inVisit == true)) &&
         (*ppTVar5 !=
          (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1])) {
        uVar4 = (*it->_vptr_TIntermTraverser[7])(it,1,this);
      }
      ppTVar5 = ppTVar5 + 1;
    } while (ppTVar5 !=
             (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  it->depth = it->depth + -1;
  pppTVar2 = &(it->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppTVar2 = *pppTVar2 + -1;
  if ((uVar4 & 1) == 0) {
    return;
  }
LAB_0049371b:
  if (it->postVisit != true) {
    return;
  }
  (*it->_vptr_TIntermTraverser[7])(it,2,this);
  return;
}

Assistant:

void TIntermAggregate::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitAggregate(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);

        if (it->rightToLeft) {
            for (TIntermSequence::reverse_iterator sit = sequence.rbegin(); sit != sequence.rend(); sit++) {
                (*sit)->traverse(it);

                if (visit && it->inVisit) {
                    if (*sit != sequence.front())
                        visit = it->visitAggregate(EvInVisit, this);
                }
            }
        } else {
            for (TIntermSequence::iterator sit = sequence.begin(); sit != sequence.end(); sit++) {
                (*sit)->traverse(it);

                if (visit && it->inVisit) {
                    if (*sit != sequence.back())
                        visit = it->visitAggregate(EvInVisit, this);
                }
            }
        }

        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitAggregate(EvPostVisit, this);
}